

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics_collector.cc
# Opt level: O2

vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> *
prometheus::detail::CollectMetrics
          (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
           *__return_storage_ptr__,
          vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
          *collectables)

{
  pointer pwVar1;
  pointer pwVar2;
  shared_ptr<prometheus::Collectable> collectable;
  __shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> local_58;
  vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pwVar1 = (collectables->
           super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pwVar2 = (collectables->
                super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pwVar2 != pwVar1; pwVar2 = pwVar2 + 1) {
    std::__shared_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,pwVar2);
    if (local_58._M_ptr != (element_type *)0x0) {
      (*(local_58._M_ptr)->_vptr_Collectable[2])(&local_48);
      std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>::
      insert<std::move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily*,std::vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>>>>,void>
                ((vector<prometheus::MetricFamily,std::allocator<prometheus::MetricFamily>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                  )local_48.
                   super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (move_iterator<__gnu_cxx::__normal_iterator<prometheus::MetricFamily_*,_std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>_>_>
                  )local_48.
                   super__Vector_base<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::~vector
                (&local_48);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<MetricFamily> CollectMetrics(
    const std::vector<std::weak_ptr<prometheus::Collectable>>& collectables) {
  auto collected_metrics = std::vector<MetricFamily>{};

  for (auto&& wcollectable : collectables) {
    auto collectable = wcollectable.lock();
    if (!collectable) {
      continue;
    }

    auto&& metrics = collectable->Collect();
    collected_metrics.insert(collected_metrics.end(),
                             std::make_move_iterator(metrics.begin()),
                             std::make_move_iterator(metrics.end()));
  }

  return collected_metrics;
}